

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLString.cpp
# Opt level: O2

BaseRefVectorOf<char16_t> *
xercesc_4_0::XMLString::tokenizeString(XMLCh *tokenizeSrc,MemoryManager *manager)

{
  int iVar1;
  XMLCh *toDelete;
  BaseRefVectorOf<char16_t> *this;
  XMLSize_t srcStrLength;
  XMLSize_t XVar2;
  undefined4 extraout_var;
  ulong uVar3;
  XMLSize_t endIndex;
  XMLSize_t startIndex;
  XMLSize_t XVar4;
  ArrayJanitor<char16_t> janText;
  
  toDelete = replicate(tokenizeSrc,manager);
  ArrayJanitor<char16_t>::ArrayJanitor(&janText,toDelete,manager);
  this = (BaseRefVectorOf<char16_t> *)XMemory::operator_new(0x30,manager);
  RefArrayVectorOf<char16_t>::RefArrayVectorOf((RefArrayVectorOf<char16_t> *)this,0x10,true,manager)
  ;
  srcStrLength = stringLen(toDelete);
  endIndex = 0;
  while (endIndex != srcStrLength) {
    uVar3 = endIndex;
    if (endIndex < srcStrLength) {
      uVar3 = srcStrLength;
    }
    while ((startIndex = uVar3, uVar3 != endIndex &&
           (startIndex = endIndex,
           (char)(&XMLChar1_0::fgCharCharsTable1_0)[(ushort)toDelete[endIndex]] < '\0'))) {
      endIndex = endIndex + 1;
    }
    XVar2 = startIndex;
    XVar4 = startIndex;
    if (startIndex < srcStrLength) {
      XVar4 = srcStrLength;
    }
    while ((endIndex = XVar4, XVar4 != XVar2 &&
           (endIndex = XVar2, -1 < (char)(&XMLChar1_0::fgCharCharsTable1_0)[(ushort)toDelete[XVar2]]
           ))) {
      XVar2 = XVar2 + 1;
    }
    if (endIndex - startIndex == 0) break;
    iVar1 = (*manager->_vptr_MemoryManager[3])(manager,(endIndex - startIndex) * 2 + 2);
    subString((XMLCh *)CONCAT44(extraout_var,iVar1),toDelete,startIndex,endIndex,srcStrLength,
              manager);
    BaseRefVectorOf<char16_t>::addElement(this,(XMLCh *)CONCAT44(extraout_var,iVar1));
  }
  ArrayJanitor<char16_t>::~ArrayJanitor(&janText);
  return this;
}

Assistant:

BaseRefVectorOf<XMLCh>* XMLString::tokenizeString(const XMLCh*      const   tokenizeSrc
                                               ,  MemoryManager*    const   manager)
{
    XMLCh* orgText = replicate(tokenizeSrc, manager);
    ArrayJanitor<XMLCh> janText(orgText, manager);
    XMLCh* tokenizeStr = orgText;

    RefArrayVectorOf<XMLCh>* tokenStack = new (manager) RefArrayVectorOf<XMLCh>(16, true, manager);

    XMLSize_t len = stringLen(tokenizeStr);
    XMLSize_t skip;
    XMLSize_t index = 0;

    while (index != len) {
        // find the first non-space character
        for (skip = index; skip < len; skip++)
        {
            if (!XMLChar1_0::isWhitespace(tokenizeStr[skip]))
                break;
        }
        index = skip;

        // find the delimiter (space character)
        for (; skip < len; skip++)
        {
            if (XMLChar1_0::isWhitespace(tokenizeStr[skip]))
                break;
        }

        // we reached the end of the string
        if (skip == index)
            break;

        // these tokens are adopted in the RefVector and will be deleted
        // when the vector is deleted by the caller
        XMLCh* token = (XMLCh*) manager->allocate
        (
            (skip+1-index) * sizeof(XMLCh)
        );//new XMLCh[skip+1-index];

        XMLString::subString(token, tokenizeStr, index, skip, len, manager);
        tokenStack->addElement(token);
        index = skip;
    }
    return tokenStack;
}